

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::kotlin::MessageGenerator::MessageGenerator
          (MessageGenerator *this,Descriptor *descriptor,Context *context)

{
  Descriptor *descriptor_00;
  bool bVar1;
  bool bVar2;
  ClassNameResolver *pCVar3;
  FieldDescriptor *pFVar4;
  reference ppVar5;
  int index;
  int local_7c;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *local_78;
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *local_70;
  OneofDescriptor *oneof;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> local_60;
  LogMessageFatal local_40 [16];
  
  this->_vptr_MessageGenerator = (_func_int **)&PTR__MessageGenerator_004aab90;
  this->context_ = context;
  pCVar3 = java::Context::GetNameResolver(context);
  this->name_resolver_ = pCVar3;
  this->descriptor_ = descriptor;
  (this->oneofs_).
  super_btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20240722::container_internal::
                 btree<absl::lts_20240722::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>
                 ::EmptyNode()::empty_node;
  (this->oneofs_).
  super_btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<std::less<int>,_int>::checked_compare,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_*,_2UL,_false>
  .value = (btree_node<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
            *)absl::lts_20240722::container_internal::
              btree<absl::lts_20240722::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>
              ::EmptyNode()::empty_node;
  (this->oneofs_).
  super_btree_map_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .
  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  .tree_.size_ = 0;
  bVar2 = (context->options_).enforce_lite;
  this->lite_ = bVar2;
  bVar1 = true;
  if (bVar2 == true) {
    bVar1 = (context->options_).jvm_dsl;
  }
  local_70 = &this->oneofs_;
  this->jvm_dsl_ = bVar1;
  java::FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
  FieldGeneratorMap(&this->lite_field_generators_,descriptor);
  local_78 = &this->field_generators_;
  java::FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
  FieldGeneratorMap(local_78,this->descriptor_);
  index = 0;
  do {
    descriptor_00 = this->descriptor_;
    if (*(int *)(descriptor_00 + 4) <= index) {
      if (this->lite_ == false) {
        java::MakeImmutableFieldGenerators(&local_60,descriptor_00,this->context_);
        java::FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
        operator=(local_78,&local_60);
        java::FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
        ~FieldGeneratorMap(&local_60);
      }
      else {
        java::MakeImmutableFieldLiteGenerators
                  ((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>
                    *)&local_60,descriptor_00,this->context_);
        java::FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
        operator=(&this->lite_field_generators_,
                  (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>
                   *)&local_60);
        java::FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
        ~FieldGeneratorMap((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>
                            *)&local_60);
      }
      return;
    }
    pFVar4 = Descriptor::field(descriptor_00,index);
    bVar2 = java::IsRealOneof(pFVar4);
    if (bVar2) {
      pFVar4 = Descriptor::field(this->descriptor_,index);
      oneof = FieldDescriptor::containing_oneof(pFVar4);
      local_7c = (int)(((long)oneof - *(long *)(*(long *)(oneof + 0x10) + 0x40)) / 0x38);
      absl::lts_20240722::container_internal::
      btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>>
      ::emplace<int,google::protobuf::OneofDescriptor_const*&>
                ((pair<absl::lts_20240722::container_internal::btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>,_bool>
                  *)&local_60,local_70,&local_7c,&oneof);
      ppVar5 = absl::lts_20240722::container_internal::
               btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
               ::operator*((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                            *)&local_60);
      if (ppVar5->second != oneof) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/kotlin/message.cc"
                   ,0x32,0x3d,"oneofs_.emplace(oneof->index(), oneof).first->second == oneof");
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

MessageGenerator::MessageGenerator(const Descriptor* descriptor,
                                   java::Context* context)
    : context_(context),
      name_resolver_(context->GetNameResolver()),
      descriptor_(descriptor),
      lite_(!java::HasDescriptorMethods(descriptor_->file(),
                                        context->EnforceLite())),
      jvm_dsl_(!lite_ || context->options().jvm_dsl),
      lite_field_generators_(
          java::FieldGeneratorMap<java::ImmutableFieldLiteGenerator>(
              descriptor_)),
      field_generators_(
          java::FieldGeneratorMap<java::ImmutableFieldGenerator>(descriptor_)) {
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (java::IsRealOneof(descriptor_->field(i))) {
      const OneofDescriptor* oneof = descriptor_->field(i)->containing_oneof();
      ABSL_CHECK(oneofs_.emplace(oneof->index(), oneof).first->second == oneof);
    }
  }
  if (lite_) {
    lite_field_generators_ =
        java::MakeImmutableFieldLiteGenerators(descriptor_, context_);
  } else {
    field_generators_ =
        java::MakeImmutableFieldGenerators(descriptor_, context_);
  }
}